

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O3

void mbedtls_mpi_core_exp_mod_optionally_safe
               (mbedtls_mpi_uint *X,mbedtls_mpi_uint *A,mbedtls_mpi_uint *N,size_t AN_limbs,
               mbedtls_mpi_uint *E,size_t E_limbs,int E_public,mbedtls_mpi_uint *RR,
               mbedtls_mpi_uint *T)

{
  mbedtls_mpi_uint *B;
  mbedtls_mpi_uint *T_00;
  size_t __n;
  long lVar1;
  long lVar2;
  mbedtls_mpi_uint *pmVar3;
  sbyte sVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  mbedtls_mpi_uint mVar9;
  size_t sVar10;
  mbedtls_mpi_uint mVar11;
  mbedtls_mpi_uint *A_00;
  mbedtls_mpi_uint *X_00;
  bool bVar12;
  ulong local_90;
  long local_88;
  ulong local_60;
  size_t local_38;
  
  if (E_public == 0x2a2a2a2a) {
    uVar5 = E_limbs & 0xffffffff;
    lVar1 = uVar5 * 0x40 + 0x40;
    lVar2 = 0;
    do {
      if ((int)uVar5 < 1) goto LAB_0034bc70;
      uVar6 = E[uVar5 - 1];
      uVar5 = uVar5 - 1;
      lVar1 = lVar1 + -0x40;
    } while (uVar6 == 0);
    uVar5 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    lVar2 = lVar1 - (uVar5 ^ 0x3f);
LAB_0034bc70:
    uVar5 = lVar2 + (ulong)(lVar2 == 0);
    E_limbs = uVar5 >> 6;
    local_60 = (ulong)((uint)uVar5 & 0x3f);
  }
  else {
    local_60 = 0;
  }
  lVar1 = (ulong)(0x4f < E_limbs << 6) * 2 + 1;
  sVar4 = (sbyte)lVar1;
  B = T + (AN_limbs << sVar4);
  mVar9 = *N;
  lVar2 = ((int)mVar9 * 2 + 4U & 8) + mVar9;
  uVar7 = 0x40;
  do {
    lVar2 = (2 - lVar2 * mVar9) * lVar2;
    bVar12 = 0xf < uVar7;
    uVar7 = uVar7 >> 1;
  } while (bVar12);
  uVar5 = 1L << sVar4;
  T_00 = B + AN_limbs;
  mVar9 = -lVar2;
  __n = AN_limbs * 8;
  memset(T,0,__n);
  *T = 1;
  mbedtls_mpi_core_montmul(T,T,RR,AN_limbs,N,AN_limbs,mVar9,T_00);
  pmVar3 = T + AN_limbs;
  switchD_00332694::default(pmVar3,A,__n);
  if (0x4f < E_limbs << 6) {
    X_00 = T + AN_limbs * 2;
    lVar2 = uVar5 - 2;
    A_00 = pmVar3;
    do {
      mbedtls_mpi_core_montmul(X_00,A_00,pmVar3,AN_limbs,N,AN_limbs,mVar9,T_00);
      A_00 = A_00 + AN_limbs;
      X_00 = X_00 + AN_limbs;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  switchD_00332694::default(X,T,__n);
  local_88 = 0;
  local_90 = 0;
  local_38 = E_limbs;
  do {
    local_38 = local_38 - (local_60 == 0);
    bVar12 = local_60 == 0;
    local_60 = local_60 - 1;
    if (bVar12) {
      local_60 = 0x3f;
    }
    mbedtls_mpi_core_montmul(X,X,X,AN_limbs,N,AN_limbs,mVar9,T_00);
    local_88 = local_88 + 1;
    local_90 = (ulong)((E[local_38] >> (local_60 & 0x3f) & 1) != 0) + local_90 * 2;
    if ((local_88 == lVar1) || (local_38 == 0 && local_60 == 0)) {
      if (E_public == 0x2a2a2a2a) {
        switchD_00332694::default(B,T + local_90 * AN_limbs,__n);
      }
      else {
        uVar6 = 0;
        pmVar3 = T;
        do {
          if ((AN_limbs != 0) && (pmVar3 != B)) {
            uVar8 = mbedtls_ct_zero ^ local_90 ^ uVar6;
            uVar8 = -(uVar8 >> 1) | -uVar8;
            sVar10 = 0;
            do {
              if ((long)uVar8 < 0) {
                mVar11 = 0;
              }
              else {
                mVar11 = pmVar3[sVar10];
              }
              B[sVar10] = (mbedtls_ct_zero ^ (long)uVar8 >> 0x3f) & B[sVar10] | mVar11;
              sVar10 = sVar10 + 1;
            } while (AN_limbs != sVar10);
          }
          uVar6 = uVar6 + 1;
          pmVar3 = pmVar3 + AN_limbs;
        } while (uVar6 != uVar5);
      }
      mbedtls_mpi_core_montmul(X,X,B,AN_limbs,N,AN_limbs,mVar9,T_00);
      local_88 = 0;
      local_90 = 0;
    }
  } while (local_38 != 0 || local_60 != 0);
  return;
}

Assistant:

static void mbedtls_mpi_core_exp_mod_optionally_safe(mbedtls_mpi_uint *X,
                                                     const mbedtls_mpi_uint *A,
                                                     const mbedtls_mpi_uint *N,
                                                     size_t AN_limbs,
                                                     const mbedtls_mpi_uint *E,
                                                     size_t E_limbs,
                                                     int E_public,
                                                     const mbedtls_mpi_uint *RR,
                                                     mbedtls_mpi_uint *T)
{
    /* We'll process the bits of E from most significant
     * (limb_index=E_limbs-1, E_bit_index=biL-1) to least significant
     * (limb_index=0, E_bit_index=0). */
    size_t E_limb_index;
    size_t E_bit_index;
    exp_mod_calc_first_bit_optionally_safe(E, E_limbs, E_public,
                                           &E_limb_index, &E_bit_index);

    const size_t wsize = exp_mod_get_window_size(E_limb_index * biL);
    const size_t welem = ((size_t) 1) << wsize;

    /* This is how we will use the temporary storage T, which must have space
     * for table_limbs, select_limbs and (2 * AN_limbs + 1) for montmul. */
    const size_t table_limbs  = welem * AN_limbs;
    const size_t select_limbs = AN_limbs;

    /* Pointers to specific parts of the temporary working memory pool */
    mbedtls_mpi_uint *const Wtable  = T;
    mbedtls_mpi_uint *const Wselect = Wtable  +  table_limbs;
    mbedtls_mpi_uint *const temp    = Wselect + select_limbs;

    /*
     * Window precomputation
     */

    const mbedtls_mpi_uint mm = mbedtls_mpi_core_montmul_init(N);

    /* Set Wtable[i] = A^i (in Montgomery representation) */
    exp_mod_precompute_window(A, N, AN_limbs,
                              mm, RR,
                              welem, Wtable, temp);

    /*
     * Fixed window exponentiation
     */

    /* X = 1 (in Montgomery presentation) initially */
    memcpy(X, Wtable, AN_limbs * ciL);

    /* At any given time, window contains window_bits bits from E.
     * window_bits can go up to wsize. */
    size_t window_bits = 0;
    mbedtls_mpi_uint window = 0;

    do {
        /* Square */
        mbedtls_mpi_core_montmul(X, X, X, AN_limbs, N, AN_limbs, mm, temp);

        /* Move to the next bit of the exponent */
        if (E_bit_index == 0) {
            --E_limb_index;
            E_bit_index = biL - 1;
        } else {
            --E_bit_index;
        }
        /* Insert next exponent bit into window */
        ++window_bits;
        window <<= 1;
        window |= (E[E_limb_index] >> E_bit_index) & 1;

        /* Clear window if it's full. Also clear the window at the end,
         * when we've finished processing the exponent. */
        if (window_bits == wsize ||
            (E_bit_index == 0 && E_limb_index == 0)) {

            exp_mod_table_lookup_optionally_safe(Wselect, Wtable, AN_limbs, welem,
                                                 window, E_public);
            /* Multiply X by the selected element. */
            mbedtls_mpi_core_montmul(X, X, Wselect, AN_limbs, N, AN_limbs, mm,
                                     temp);
            window = 0;
            window_bits = 0;
        }
    } while (!(E_bit_index == 0 && E_limb_index == 0));
}